

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_stream_start(yaml_parser_t *parser,yaml_event_t *event)

{
  int iVar1;
  yaml_token_t *local_30;
  yaml_token_t *token;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (parser->token_available == 0) {
    iVar1 = yaml_parser_fetch_more_tokens(parser);
    if (iVar1 == 0) {
      local_30 = (yaml_token_t *)0x0;
      goto LAB_001144a4;
    }
  }
  local_30 = (parser->tokens).head;
LAB_001144a4:
  if (local_30 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (local_30->type == YAML_STREAM_START_TOKEN) {
    parser->state = YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE;
    memset(event,0,0x68);
    event->type = YAML_STREAM_START_EVENT;
    (event->start_mark).index = (local_30->start_mark).index;
    (event->start_mark).line = (local_30->start_mark).line;
    (event->start_mark).column = (local_30->start_mark).column;
    (event->end_mark).index = (local_30->start_mark).index;
    (event->end_mark).line = (local_30->start_mark).line;
    (event->end_mark).column = (local_30->start_mark).column;
    (event->data).stream_start.encoding = (local_30->data).stream_start.encoding;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    parser_local._4_4_ = 1;
  }
  else {
    parser_local._4_4_ =
         yaml_parser_set_parser_error
                   (parser,"did not find expected <stream-start>",local_30->start_mark);
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_stream_start(yaml_parser_t *parser, yaml_event_t *event)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type != YAML_STREAM_START_TOKEN) {
        return yaml_parser_set_parser_error(parser,
                "did not find expected <stream-start>", token->start_mark);
    }

    parser->state = YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE;
    STREAM_START_EVENT_INIT(*event, token->data.stream_start.encoding,
            token->start_mark, token->start_mark);
    SKIP_TOKEN(parser);

    return 1;
}